

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O3

void printf_test(void)

{
  int iVar1;
  ulong *puVar2;
  ulong uVar3;
  bitset_container_t *v;
  ulong uVar4;
  
  v = bitset_container_create();
  _assert_true((unsigned_long)v,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x36);
  puVar2 = v->words;
  uVar3 = *puVar2;
  iVar1 = v->cardinality;
  *puVar2 = uVar3 | 0x40e;
  uVar4 = puVar2[0x9c] | 0x10000;
  v->cardinality =
       ((uint)(puVar2[0x9c] >> 0x10) ^ (uint)(uVar4 >> 0x10)) +
       (int)((uVar3 ^ (uVar3 | 0x40e)) >> 10) +
       (uint)((uVar3 & 4) == 0) + iVar1 + (uint)((uVar3 & 2) == 0) + (uint)((uVar3 & 8) == 0);
  puVar2[0x9c] = uVar4;
  bitset_container_printf(v);
  putchar(10);
  bitset_container_free(v);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);

    bitset_container_set(B, 1U);
    bitset_container_set(B, 2U);
    bitset_container_set(B, 3U);
    bitset_container_set(B, 10U);
    bitset_container_set(B, 10000U);

    bitset_container_printf(B);  // does it crash?
    printf("\n");

    bitset_container_free(B);
}